

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O1

void __thiscall
MIDIplay::noteUpdate
          (MIDIplay *this,size_t midCh,notes_iterator i,uint props_mask,int32_t select_adlchn)

{
  uint32_t *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  OPL3 *pOVar6;
  pointer pAVar7;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar8;
  NoteHook p_Var9;
  undefined8 uVar10;
  users_iterator uVar11;
  pl_basic_cell<MIDIplay::AdlChannel::LocationData> *ppVar12;
  pl_cell<MIDIplay::AdlChannel::LocationData> *ppVar13;
  uint uVar14;
  ulong uVar15;
  byte bVar16;
  pointer pMVar17;
  Phys *pPVar18;
  long lVar19;
  double dVar20;
  OplTimbre *instrument;
  Phys *ph;
  bool bVar21;
  double dVar22;
  double dVar23;
  Location my_loc;
  Location local_9c;
  int local_98;
  int local_94;
  double local_90;
  long local_88;
  Phys *local_80;
  OPL3 *local_78;
  size_t local_70;
  OplInstMeta *local_68;
  double local_60;
  ulong local_58;
  double local_50;
  double local_48;
  double local_40;
  NoteInfo *local_38;
  
  pOVar6 = (this->m_synth).m_p;
  local_94 = (int)((i.cell_)->value).noteTone;
  local_40 = ((i.cell_)->value).currentTone;
  local_58 = (ulong)((i.cell_)->value).vol;
  local_98 = (int)((i.cell_)->value).midiins;
  local_68 = ((i.cell_)->value).ains;
  local_9c.note = ((i.cell_)->value).note;
  local_9c.MidCh = (uint16_t)midCh;
  local_70 = midCh;
  if (((i.cell_)->value).isBlank == true) {
    if ((props_mask & 0x20) == 0) {
      return;
    }
    pMVar17 = (this->m_midiChannels).
              super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
              _M_impl.super__Vector_impl_data._M_start + midCh;
  }
  else {
    uVar15 = (ulong)((i.cell_)->value).chip_channels_count;
    local_78 = pOVar6;
    if (uVar15 != 0) {
      instrument = &((i.cell_)->value).chip_channels[0].op;
      do {
        uVar3._0_1_ = instrument[-1].feedconn;
        uVar3._1_1_ = instrument[-1].noteOffset;
        if (((props_mask & 1) != 0) && (select_adlchn < 0 || (uint)uVar3 == select_adlchn)) {
          ::OPL3::setPatch(local_78,(ulong)uVar3,instrument);
          uVar11 = AdlChannel::find_or_create_user
                             ((this->m_chipChannels).
                              super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar3,&local_9c);
          if (((uVar11.cell_)->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next !=
              (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) {
            ((uVar11.cell_)->value).sustained = 0;
            ((uVar11.cell_)->value).vibdelay_us = 0;
            uVar3 = local_68->soundKeyOnMs;
            ((uVar11.cell_)->value).fixed_sustain = (ulong)uVar3 == 40000;
            ((uVar11.cell_)->value).kon_time_until_neglible_us = (ulong)uVar3 * 1000;
            uVar10 = *(undefined8 *)((long)&instrument->carrier_E862 + 2);
            *(undefined8 *)&((uVar11.cell_)->value).ins = *(undefined8 *)&instrument[-1].feedconn;
            *(undefined8 *)((long)&((uVar11.cell_)->value).ins.op.carrier_E862 + 2) = uVar10;
          }
        }
        instrument = (OplTimbre *)&instrument[1].carrier_E862;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
    if (((i.cell_)->value).chip_channels_count != 0) {
      local_38 = &(i.cell_)->value;
      pPVar18 = ((i.cell_)->value).chip_channels;
      uVar14 = 0;
      lVar19 = local_70 * 0x140;
      local_88 = lVar19;
      local_80 = pPVar18;
      do {
        uVar3 = pPVar18[uVar14].chip_chan;
        dVar20 = (double)(ulong)uVar3;
        uVar4 = ((i.cell_)->value).chip_channels[1].chip_chan;
        if ((select_adlchn < 0) || ((uint)uVar3 == select_adlchn)) {
          ph = pPVar18 + uVar14;
          if ((props_mask & 0x20) == 0) {
            if ((props_mask & 2) != 0) {
              ::OPL3::setPan(local_78,(size_t)dVar20,
                             ((this->m_midiChannels).
                              super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                              ._M_impl.super__Vector_impl_data._M_start)->noteAftertouch
                             [lVar19 + 0xffffffffffffffe9]);
              pPVar18 = local_80;
              lVar19 = local_88;
            }
            if ((props_mask & 4) != 0) {
              pMVar17 = (this->m_midiChannels).
                        super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar16 = pMVar17->_padding2[lVar19 + 0xfffffffffffffffe];
              uVar15 = (ulong)((uint)bVar16 + (uint)bVar16);
              if (0x3f < bVar16) {
                uVar15 = 0x7f;
              }
              if ((this->m_setup).fullRangeBrightnessCC74 != false) {
                uVar15 = (ulong)bVar16;
              }
              ::OPL3::touchNote(local_78,(size_t)dVar20,local_58,
                                (ulong)pMVar17->noteAftertouch[lVar19 + 0xffffffffffffffe7],
                                (ulong)pMVar17->noteAftertouch[lVar19 + 0xffffffffffffffe8],uVar15,
                                (bool)(local_70 == 9 |
                                      pMVar17->_padding2[lVar19 + 0xffffffffffffffff] & 1U));
              pPVar18 = local_80;
              lVar19 = local_88;
            }
            if ((props_mask & 8) != 0) {
              pAVar7 = (this->m_chipChannels).
                       super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar12 = &pAVar7[(long)dVar20].users.endcell_;
              for (ppVar8 = pAVar7[(long)dVar20].users.first_;
                  (ppVar13 = (pl_cell<MIDIplay::AdlChannel::LocationData> *)ppVar12,
                  ppVar8 != (pl_cell<MIDIplay::AdlChannel::LocationData> *)ppVar12 &&
                  ((*(uint16_t *)&ppVar8->value != local_9c.MidCh ||
                   (ppVar13 = ppVar8, *(uint8_t *)((long)&ppVar8->value + 2) != local_9c.note))));
                  ppVar8 = *(pl_cell<MIDIplay::AdlChannel::LocationData> **)
                            ((long)&ppVar8->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>
                            + 8)) {
              }
              if (((ppVar13->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next ==
                   (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) ||
                 (*(int *)((bool *)((long)ppVar13 + 0x10) + 4) == 0)) {
                pMVar17 = (this->m_midiChannels).
                          super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar16 = pMVar17->noteAftertouch[lVar19 + 0xffffffffffffffeb];
                if (pMVar17->noteAftertouch[lVar19 + 0xffffffffffffffeb] <
                    pMVar17->noteAftertouch[lVar19 + 0xffffffffffffffea]) {
                  bVar16 = pMVar17->noteAftertouch[lVar19 + 0xffffffffffffffea];
                }
                bVar2 = ((i.cell_)->value).vibrato;
                if (bVar16 <= bVar2) {
                  bVar16 = bVar2;
                }
                dVar22 = 0.0;
                if (((local_68->flags & 1) != 0) && (ph->pseudo4op == true)) {
                  dVar22 = local_68->voice2_fine_tune;
                }
                local_90 = (double)*(int *)(pMVar17->_padding + lVar19 + 7) *
                           *(double *)(pMVar17->_padding + lVar19 + 0xf);
                dVar23 = (double)(int)(ph->op).noteOffset + local_90;
                if ((bVar16 != 0) &&
                   (((ppVar13->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next ==
                     (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0 ||
                    (*(long *)(pMVar17->_padding2 + lVar19 + 0xfffffffffffffff3) <=
                     *(long *)((long)((long)ppVar13 + 0x30) + 8))))) {
                  local_50 = (double)bVar16 *
                             *(double *)(pMVar17->_padding2 + lVar19 + 0xffffffffffffffeb);
                  local_60 = dVar22;
                  local_48 = dVar23;
                  dVar22 = sin(*(double *)(pMVar17->_padding + lVar19 + 0x1f));
                  dVar23 = local_48 + dVar22 * local_50;
                  dVar22 = local_60;
                }
                ::OPL3::noteOn(local_78,(size_t)dVar20,(ulong)uVar4,dVar22 + dVar23 + local_40);
                p_Var9 = (this->hooks).onNote;
                pPVar18 = local_80;
                lVar19 = local_88;
                if (p_Var9 != (NoteHook)0x0) {
                  (*p_Var9)((this->hooks).onNote_userData,(uint)uVar3,local_94,local_98,
                            (int)local_58,local_90);
                  pPVar18 = local_80;
                  lVar19 = local_88;
                }
              }
            }
          }
          else {
            if (((this->m_midiChannels).
                 super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
                 _M_impl.super__Vector_impl_data._M_start)->noteAftertouch
                [lVar19 + 0xffffffffffffffee] == '\0') {
              pAVar7 = (this->m_chipChannels).
                       super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_90 = (double)((long)dVar20 * 0x58);
              ppVar12 = &pAVar7[(long)dVar20].users.endcell_;
              ppVar8 = pAVar7[(long)dVar20].users.first_;
              while ((ppVar13 = (pl_cell<MIDIplay::AdlChannel::LocationData> *)ppVar12,
                     ppVar8 != (pl_cell<MIDIplay::AdlChannel::LocationData> *)ppVar12 &&
                     (((ppVar8->value).loc.MidCh != local_9c.MidCh ||
                      (ppVar13 = ppVar8, (ppVar8->value).loc.note != local_9c.note))))) {
                ppVar8 = (ppVar8->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next;
              }
              if ((ppVar13->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next ==
                  (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) {
                bVar21 = false;
              }
              else {
                bVar21 = ((ppVar13->value).sustained & 2) == 0;
              }
              local_60 = dVar20;
              if (bVar21) {
                pl_list<MIDIplay::AdlChannel::LocationData>::deallocate
                          (&pAVar7[(long)dVar20].users,ppVar13);
              }
              p_Var9 = (this->hooks).onNote;
              if (p_Var9 != (NoteHook)0x0) {
                (*p_Var9)((this->hooks).onNote_userData,(uint)uVar3,local_94,local_98,0,0.0);
              }
              dVar20 = local_60;
              pOVar6 = local_78;
              if ((bVar21) &&
                 (*(long *)((long)&(((this->m_chipChannels).
                                     super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->users).size_ +
                           (long)local_90) == 0)) {
                ::OPL3::noteOff(local_78,(size_t)local_60);
                if ((props_mask & 0x40) == 0) {
                  *(ulong *)((long)&((this->m_chipChannels).
                                     super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                    koff_time_until_neglible_us + (long)local_90) =
                       (ulong)local_68->soundKeyOffMs * 1000;
                }
                else {
                  ::OPL3::touchNote(pOVar6,(size_t)dVar20,0,0,0,0x7f,false);
                  *(undefined8 *)
                   ((long)&((this->m_chipChannels).
                            super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                            ._M_impl.super__Vector_impl_data._M_start)->koff_time_until_neglible_us
                   + (long)local_90) = 0;
                }
              }
            }
            else {
              uVar11 = AdlChannel::find_or_create_user
                                 ((this->m_chipChannels).
                                  super__Vector_base<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (long)dVar20,&local_9c
                                 );
              if (((uVar11.cell_)->super_pl_basic_cell<MIDIplay::AdlChannel::LocationData>).next !=
                  (pl_cell<MIDIplay::AdlChannel::LocationData> *)0x0) {
                puVar1 = &((uVar11.cell_)->value).sustained;
                *(byte *)puVar1 = (byte)*puVar1 | 1;
              }
              p_Var9 = (this->hooks).onNote;
              if (p_Var9 != (NoteHook)0x0) {
                (*p_Var9)((this->hooks).onNote_userData,(uint)uVar3,local_94,local_98,-1,0.0);
              }
            }
            MIDIchannel::NoteInfo::phys_erase_at(local_38,ph);
            uVar14 = uVar14 - 1;
            pPVar18 = local_80;
            lVar19 = local_88;
          }
        }
        uVar14 = uVar14 + 1;
        uVar5 = ((i.cell_)->value).chip_channels_count;
      } while (uVar14 < uVar5);
      if (uVar5 != 0) {
        return;
      }
    }
    pMVar17 = (this->m_midiChannels).
              super__Vector_base<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>.
              _M_impl.super__Vector_impl_data._M_start + local_70;
    if (((i.cell_)->value).glideRate < INFINITY) {
      pMVar17->gliding_note_count = pMVar17->gliding_note_count - 1;
    }
    if (0.0 < ((i.cell_)->value).ttl) {
      pMVar17->extended_note_count = pMVar17->extended_note_count - 1;
    }
  }
  pl_list<MIDIplay::MIDIchannel::NoteInfo>::deallocate(&pMVar17->activenotes,i.cell_);
  return;
}

Assistant:

void MIDIplay::noteUpdate(size_t midCh,
                          MIDIplay::MIDIchannel::notes_iterator i,
                          unsigned props_mask,
                          int32_t select_adlchn)
{
    Synth &synth = *m_synth;
    MIDIchannel::NoteInfo &info = i->value;
    const int16_t noteTone    = info.noteTone;
    const double currentTone    = info.currentTone;
    const uint8_t vol     = info.vol;
    const int midiins     = static_cast<int>(info.midiins);
    const OplInstMeta &ains = *info.ains;
    AdlChannel::Location my_loc;
    my_loc.MidCh = static_cast<uint16_t>(midCh);
    my_loc.note  = info.note;

    if(info.isBlank)
    {
        if(props_mask & Upd_Off)
            m_midiChannels[midCh].activenotes.erase(i);
        return;
    }

    for(unsigned ccount = 0, ctotal = info.chip_channels_count; ccount < ctotal; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn) continue;

        if(props_mask & Upd_Patch)
        {
            synth.setPatch(c, ins.op);
            AdlChannel::users_iterator i = m_chipChannels[c].find_or_create_user(my_loc);
            if(!i.is_end())    // inserts if necessary
            {
                AdlChannel::LocationData &d = i->value;
                d.sustained = AdlChannel::LocationData::Sustain_None;
                d.vibdelay_us = 0;
                d.fixed_sustain = (ains.soundKeyOnMs == static_cast<uint16_t>(OPLNoteOnMaxTime));
                d.kon_time_until_neglible_us = 1000 * ains.soundKeyOnMs;
                d.ins       = ins;
            }
        }
    }

    for(unsigned ccount = 0; ccount < info.chip_channels_count; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c          = ins.chip_chan;
        uint16_t c_secondary    = info.chip_channels[1].chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn)
            continue;

        if(props_mask & Upd_Off) // note off
        {
            if(!m_midiChannels[midCh].sustain)
            {
                AdlChannel::users_iterator k = m_chipChannels[c].find_user(my_loc);
                bool do_erase_user = (!k.is_end() && ((k->value.sustained & AdlChannel::LocationData::Sustain_Sostenuto) == 0));
                if(do_erase_user)
                    m_chipChannels[c].users.erase(k);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, 0, 0.0);

                if(do_erase_user && m_chipChannels[c].users.empty())
                {
                    synth.noteOff(c);
                    if(props_mask & Upd_Mute) // Mute the note
                    {
                        synth.touchNote(c, 0, 0, 0);
                        m_chipChannels[c].koff_time_until_neglible_us = 0;
                    }
                    else
                    {
                        m_chipChannels[c].koff_time_until_neglible_us = 1000 * int64_t(ains.soundKeyOffMs);
                    }
                }
            }
            else
            {
                // Sustain: Forget about the note, but don't key it off.
                //          Also will avoid overwriting it very soon.
                AdlChannel::users_iterator d = m_chipChannels[c].find_or_create_user(my_loc);
                if(!d.is_end())
                    d->value.sustained |= AdlChannel::LocationData::Sustain_Pedal; // note: not erased!
                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, -1, 0.0);
            }

            info.phys_erase_at(&ins);  // decrements channel count
            --ccount;  // adjusts index accordingly
            continue;
        }

        if(props_mask & Upd_Pan)
            synth.setPan(c, m_midiChannels[midCh].panning);

        if(props_mask & Upd_Volume)
        {
            const MIDIchannel &ch = m_midiChannels[midCh];
            bool is_percussion = (midCh == 9) || ch.is_xg_percussion;
            uint_fast32_t brightness = ch.brightness;

            if(!m_setup.fullRangeBrightnessCC74)
            {
                // Simulate post-High-Pass filter result which affects sounding by half level only
                if(brightness >= 64)
                    brightness = 127;
                else
                    brightness *= 2;
            }

            synth.touchNote(c,
                            vol,
                            ch.volume,
                            ch.expression,
                            brightness,
                            is_percussion);

            /* DEBUG ONLY!!!
            static uint32_t max = 0;

            if(volume == 0)
                max = 0;

            if(volume > max)
                max = volume;

            printf("%d\n", max);
            fflush(stdout);
            */
        }

        if(props_mask & Upd_Pitch)
        {
            AdlChannel::users_iterator d = m_chipChannels[c].find_user(my_loc);

            // Don't bend a sustained note
            if(d.is_end() || (d->value.sustained == AdlChannel::LocationData::Sustain_None))
            {
                MIDIchannel &chan = m_midiChannels[midCh];
                double midibend = chan.bend * chan.bendsense;
                double bend = midibend + ins.op.noteOffset;
                double phase = 0.0;
                uint8_t vibrato = std::max(chan.vibrato, chan.aftertouch);

                vibrato = std::max(vibrato, info.vibrato);

                if((ains.flags & OplInstMeta::Flag_Pseudo4op) && ins.pseudo4op)
                {
                    phase = ains.voice2_fine_tune;
                }

                if(vibrato && (d.is_end() || d->value.vibdelay_us >= chan.vibdelay_us))
                    bend += static_cast<double>(vibrato) * chan.vibdepth * std::sin(chan.vibpos);

                synth.noteOn(c, c_secondary, currentTone + bend + phase);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, midiins, vol, midibend);
            }
        }
    }

    if(info.chip_channels_count == 0)
    {
        m_midiChannels[midCh].cleanupNote(i);
        m_midiChannels[midCh].activenotes.erase(i);
    }
}